

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall cmLocalGenerator::CreateEvaluationFileOutputs(cmLocalGenerator *this,string *config)

{
  bool bVar1;
  reference ppcVar2;
  __normal_iterator<cmGeneratorExpressionEvaluationFile_**,_std::vector<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>_>
  local_48;
  __normal_iterator<cmGeneratorExpressionEvaluationFile_**,_std::vector<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>_>
  local_40;
  __normal_iterator<cmGeneratorExpressionEvaluationFile_*const_*,_std::vector<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>_>
  local_38;
  const_iterator li;
  vector<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>
  ef;
  string *config_local;
  cmLocalGenerator *this_local;
  
  cmMakefile::GetEvaluationFiles
            ((vector<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>
              *)&li,this->Makefile);
  local_40._M_current =
       (cmGeneratorExpressionEvaluationFile **)
       std::
       vector<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>
       ::begin((vector<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>
                *)&li);
  __gnu_cxx::
  __normal_iterator<cmGeneratorExpressionEvaluationFile*const*,std::vector<cmGeneratorExpressionEvaluationFile*,std::allocator<cmGeneratorExpressionEvaluationFile*>>>
  ::__normal_iterator<cmGeneratorExpressionEvaluationFile**>
            ((__normal_iterator<cmGeneratorExpressionEvaluationFile*const*,std::vector<cmGeneratorExpressionEvaluationFile*,std::allocator<cmGeneratorExpressionEvaluationFile*>>>
              *)&local_38,&local_40);
  while( true ) {
    local_48._M_current =
         (cmGeneratorExpressionEvaluationFile **)
         std::
         vector<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>
         ::end((vector<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>
                *)&li);
    bVar1 = __gnu_cxx::operator!=(&local_38,&local_48);
    if (!bVar1) break;
    ppcVar2 = __gnu_cxx::
              __normal_iterator<cmGeneratorExpressionEvaluationFile_*const_*,_std::vector<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>_>
              ::operator*(&local_38);
    cmGeneratorExpressionEvaluationFile::CreateOutputFile(*ppcVar2,this,config);
    __gnu_cxx::
    __normal_iterator<cmGeneratorExpressionEvaluationFile_*const_*,_std::vector<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>_>
    ::operator++(&local_38);
  }
  std::
  vector<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>
  ::~vector((vector<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>
             *)&li);
  return;
}

Assistant:

void cmLocalGenerator::CreateEvaluationFileOutputs(std::string const& config)
{
  std::vector<cmGeneratorExpressionEvaluationFile*> ef =
    this->Makefile->GetEvaluationFiles();
  for (std::vector<cmGeneratorExpressionEvaluationFile*>::const_iterator li =
         ef.begin();
       li != ef.end(); ++li) {
    (*li)->CreateOutputFile(this, config);
  }
}